

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

intrusive_list<(anonymous_namespace)::TestObject> * __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::operator=
          (intrusive_list<(anonymous_namespace)::TestObject> *this,
          intrusive_list<(anonymous_namespace)::TestObject> *other)

{
  intrusive_list<(anonymous_namespace)::TestObject> *other_local;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  
  clear(this);
  this->first_ = other->first_;
  this->last_ = other->last_;
  this->size_ = other->size_;
  other->last_ = (TestObject *)0x0;
  other->first_ = (TestObject *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline intrusive_list<T>& intrusive_list<T>::operator=(
    intrusive_list<T>&& other) {
  clear();
  first_ = other.first_;
  last_ = other.last_;
  size_ = other.size_;
  other.first_ = other.last_ = nullptr;
  other.size_ = 0;
  return *this;
}